

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

char * __thiscall json::Value::parse(Value *this,char *curr,StringEncoding stringEncoding)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  JsonParseException *pJVar4;
  Value *pVVar5;
  element_type *peVar6;
  mapped_type *this_00;
  bool bVar7;
  double n;
  char *local_218;
  char *after;
  string local_208;
  undefined1 local_1e8 [8];
  Ref value;
  string local_1d0;
  undefined1 local_1b0 [8];
  IString key;
  string local_198;
  char *local_178;
  char *close_1;
  string local_168;
  undefined1 local_142;
  allocator<char> local_141;
  string local_140;
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_ca;
  allocator<char> local_c9;
  string local_c8;
  int local_a4;
  undefined1 local_a0 [8];
  Ref temp;
  char *raw;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *close;
  char *pcStack_18;
  StringEncoding stringEncoding_local;
  char *curr_local;
  Value *this_local;
  
  pcStack_18 = curr;
  while( true ) {
    bVar7 = false;
    if ((((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
        (bVar7 = true, *pcStack_18 != '\t')) && (bVar7 = true, *pcStack_18 != '\n')) {
      bVar7 = *pcStack_18 == '\r';
    }
    if (!bVar7) break;
    pcStack_18 = pcStack_18 + 1;
  }
  pcVar2 = pcStack_18;
  close._4_4_ = stringEncoding;
  curr_local = (char *)this;
  if (*pcStack_18 == '\"') {
    while( true ) {
      pcVar1 = pcVar2;
      local_28 = pcVar1 + 1;
      bVar7 = false;
      if (*local_28 != '\0') {
        bVar7 = *local_28 != '\"';
      }
      if (!bVar7) break;
      pcVar2 = local_28;
      if ((*local_28 == '\\') && (local_28 = pcVar1 + 2, pcVar2 = local_28, *local_28 == '\0')) {
        local_5d = 1;
        pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"unexpected end of JSON string (quoting)",&local_49);
        JsonParseException::JsonParseException(pJVar4,&local_48);
        local_5d = 0;
        __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
    }
    if (local_28 == (char *)0x0) {
      raw._6_1_ = 1;
      pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"unexpected end of JSON string",
                 (allocator<char> *)((long)&raw + 7));
      JsonParseException::JsonParseException(pJVar4,&local_80);
      raw._6_1_ = 0;
      __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    *local_28 = '\0';
    temp.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pcStack_18 + 1);
    if (stringEncoding == ASCII) {
      setString(this,(char *)temp.super_shared_ptr<json::Value>.
                             super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi);
    }
    else {
      if (stringEncoding != WTF16) {
        __assert_fail("stringEncoding == WTF16",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                      ,0x131,"char *json::Value::parse(char *, StringEncoding)");
      }
      unescapeIntoWTF16(this,(char *)temp.super_shared_ptr<json::Value>.
                                     super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
    }
    pcStack_18 = local_28 + 1;
  }
  else if (*pcStack_18 == '[') {
    do {
      pcStack_18 = pcStack_18 + 1;
      bVar7 = false;
      if ((((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
          (bVar7 = true, *pcStack_18 != '\t')) && (bVar7 = true, *pcStack_18 != '\n')) {
        bVar7 = *pcStack_18 == '\r';
      }
    } while (bVar7);
    setArray(this,0);
    do {
      if (*pcStack_18 == ']') break;
      pVVar5 = (Value *)operator_new(0x18);
      Value(pVVar5);
      Ref::Ref((Ref *)local_a0,pVVar5);
      std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>::push_back
                ((this->field_1).arr,(Ref *)local_a0);
      peVar6 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a0);
      pcStack_18 = parse(peVar6,pcStack_18,close._4_4_);
      while( true ) {
        bVar7 = false;
        if (((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
           ((bVar7 = true, *pcStack_18 != '\t' && (bVar7 = true, *pcStack_18 != '\n')))) {
          bVar7 = *pcStack_18 == '\r';
        }
        if (!bVar7) break;
        pcStack_18 = pcStack_18 + 1;
      }
      if (*pcStack_18 == ']') {
        local_a4 = 9;
      }
      else {
        if (*pcStack_18 != ',') {
          local_ca = 1;
          pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"malformed JSON array",&local_c9);
          JsonParseException::JsonParseException(pJVar4,&local_c8);
          local_ca = 0;
          __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
        }
        do {
          pcStack_18 = pcStack_18 + 1;
          bVar7 = false;
          if (((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
             ((bVar7 = true, *pcStack_18 != '\t' && (bVar7 = true, *pcStack_18 != '\n')))) {
            bVar7 = *pcStack_18 == '\r';
          }
        } while (bVar7);
        local_a4 = 0;
      }
      Ref::~Ref((Ref *)local_a0);
    } while (local_a4 == 0);
    pcStack_18 = pcStack_18 + 1;
  }
  else if (*pcStack_18 == 'n') {
    iVar3 = strncmp(pcStack_18,"null",4);
    if (iVar3 != 0) {
      local_f2 = 1;
      pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"unexpected JSON literal",&local_f1);
      JsonParseException::JsonParseException(pJVar4,&local_f0);
      local_f2 = 0;
      __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    setNull(this);
    pcStack_18 = pcStack_18 + 4;
  }
  else if (*pcStack_18 == 't') {
    iVar3 = strncmp(pcStack_18,"true",4);
    if (iVar3 != 0) {
      local_11a = 1;
      pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"unexpected JSON literal",&local_119);
      JsonParseException::JsonParseException(pJVar4,&local_118);
      local_11a = 0;
      __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    setBool(this,true);
    pcStack_18 = pcStack_18 + 4;
  }
  else if (*pcStack_18 == 'f') {
    iVar3 = strncmp(pcStack_18,"false",5);
    if (iVar3 != 0) {
      local_142 = 1;
      pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"unexpected JSON literal",&local_141);
      JsonParseException::JsonParseException(pJVar4,&local_140);
      local_142 = 0;
      __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    setBool(this,false);
    pcStack_18 = pcStack_18 + 5;
  }
  else if (*pcStack_18 == '{') {
    do {
      pcStack_18 = pcStack_18 + 1;
      bVar7 = false;
      if (((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
         ((bVar7 = true, *pcStack_18 != '\t' && (bVar7 = true, *pcStack_18 != '\n')))) {
        bVar7 = *pcStack_18 == '\r';
      }
    } while (bVar7);
    setObject(this);
    do {
      if (*pcStack_18 == '}') break;
      if (*pcStack_18 != '\"') {
        close_1._6_1_ = 1;
        pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"malformed key in JSON object",
                   (allocator<char> *)((long)&close_1 + 7));
        JsonParseException::JsonParseException(pJVar4,&local_168);
        close_1._6_1_ = 0;
        __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
      pcStack_18 = pcStack_18 + 1;
      local_178 = strchr(pcStack_18,0x22);
      if (local_178 == (char *)0x0) {
        key.str._M_str._6_1_ = 1;
        pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_198,"malformed key in JSON object",
                   (allocator<char> *)((long)&key.str._M_str + 7));
        JsonParseException::JsonParseException(pJVar4,&local_198);
        key.str._M_str._6_1_ = 0;
        __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
      *local_178 = '\0';
      ::wasm::IString::IString((IString *)local_1b0,pcStack_18);
      pcVar2 = local_178;
      do {
        pcVar1 = pcVar2;
        pcStack_18 = pcVar1 + 1;
        bVar7 = false;
        if (((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
           ((bVar7 = true, *pcStack_18 != '\t' && (bVar7 = true, *pcStack_18 != '\n')))) {
          bVar7 = *pcStack_18 == '\r';
        }
        pcVar2 = pcStack_18;
      } while (bVar7);
      if (*pcStack_18 != ':') {
        value.super_shared_ptr<json::Value>.
        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
        pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"missing \':\', in JSON object",
                   (allocator<char> *)
                   ((long)&value.super_shared_ptr<json::Value>.
                           super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        JsonParseException::JsonParseException(pJVar4,&local_1d0);
        value.super_shared_ptr<json::Value>.
        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
        __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
      pcStack_18 = pcVar1 + 2;
      while( true ) {
        bVar7 = false;
        if ((((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
            (bVar7 = true, *pcStack_18 != '\t')) && (bVar7 = true, *pcStack_18 != '\n')) {
          bVar7 = *pcStack_18 == '\r';
        }
        if (!bVar7) break;
        pcStack_18 = pcStack_18 + 1;
      }
      pVVar5 = (Value *)operator_new(0x18);
      Value(pVVar5);
      Ref::Ref((Ref *)local_1e8,pVVar5);
      peVar6 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1e8);
      pcStack_18 = parse(peVar6,pcStack_18,close._4_4_);
      this_00 = std::
                unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
                ::operator[]((unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
                              *)(this->field_1).arr,(key_type *)local_1b0);
      Ref::operator=(this_00,(Ref *)local_1e8);
      while( true ) {
        bVar7 = false;
        if (((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
           ((bVar7 = true, *pcStack_18 != '\t' && (bVar7 = true, *pcStack_18 != '\n')))) {
          bVar7 = *pcStack_18 == '\r';
        }
        if (!bVar7) break;
        pcStack_18 = pcStack_18 + 1;
      }
      if (*pcStack_18 == '}') {
        local_a4 = 0x11;
      }
      else {
        if (*pcStack_18 != ',') {
          after._6_1_ = 1;
          pJVar4 = (JsonParseException *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"malformed value in JSON object",
                     (allocator<char> *)((long)&after + 7));
          JsonParseException::JsonParseException(pJVar4,&local_208);
          after._6_1_ = 0;
          __cxa_throw(pJVar4,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
        }
        do {
          pcStack_18 = pcStack_18 + 1;
          bVar7 = false;
          if (((*pcStack_18 != '\0') && (bVar7 = true, *pcStack_18 != ' ')) &&
             ((bVar7 = true, *pcStack_18 != '\t' && (bVar7 = true, *pcStack_18 != '\n')))) {
            bVar7 = *pcStack_18 == '\r';
          }
        } while (bVar7);
        local_a4 = 0;
      }
      Ref::~Ref((Ref *)local_1e8);
    } while (local_a4 == 0);
    pcStack_18 = pcStack_18 + 1;
  }
  else {
    n = strtod(pcStack_18,&local_218);
    setNumber(this,n);
    pcStack_18 = local_218;
  }
  return pcStack_18;
}

Assistant:

char* parse(char* curr, StringEncoding stringEncoding) {
#define is_json_space(x)                                                       \
  (x == 32 || x == 9 || x == 10 ||                                             \
   x == 13) /* space, tab, linefeed/newline, or return */
#define skip()                                                                 \
  {                                                                            \
    while (*curr && is_json_space(*curr))                                      \
      curr++;                                                                  \
  }
    skip();
    if (*curr == '"') {
      // String
      // Start |close| after the opening ", and in the loop below we will always
      // begin looking at the first character after.
      char* close = curr + 1;
      // Skip escaped ", which appears as \". We need to be careful though, as
      // \" might also be \\" which would be an escaped \ and an *un*escaped ".
      while (*close && *close != '"') {
        if (*close == '\\') {
          // Skip the \ and the character after it, which it escapes.
          close++;
          THROW_IF(!*close, "unexpected end of JSON string (quoting)");
        }
        close++;
      }
      THROW_IF(!close, "unexpected end of JSON string");
      *close = 0; // end this string, and reuse it straight from the input
      char* raw = curr + 1;
      if (stringEncoding == ASCII) {
        // Just use the current string.
        setString(raw);
      } else {
        assert(stringEncoding == WTF16);
        unescapeIntoWTF16(raw);
      }
      curr = close + 1;
    } else if (*curr == '[') {
      // Array
      curr++;
      skip();
      setArray();
      while (*curr != ']') {
        Ref temp = Ref(new Value());
        arr->push_back(temp);
        curr = temp->parse(curr, stringEncoding);
        skip();
        if (*curr == ']') {
          break;
        }
        THROW_IF(*curr != ',', "malformed JSON array");
        curr++;
        skip();
      }
      curr++;
    } else if (*curr == 'n') {
      // Null
      THROW_IF(strncmp(curr, "null", 4) != 0, "unexpected JSON literal");
      setNull();
      curr += 4;
    } else if (*curr == 't') {
      // Bool true
      THROW_IF(strncmp(curr, "true", 4) != 0, "unexpected JSON literal");
      setBool(true);
      curr += 4;
    } else if (*curr == 'f') {
      // Bool false
      THROW_IF(strncmp(curr, "false", 5) != 0, "unexpected JSON literal");
      setBool(false);
      curr += 5;
    } else if (*curr == '{') {
      // Object
      curr++;
      skip();
      setObject();
      while (*curr != '}') {
        THROW_IF(*curr != '"', "malformed key in JSON object");
        curr++;
        char* close = strchr(curr, '"');
        THROW_IF(!close, "malformed key in JSON object");
        *close = 0; // end this string, and reuse it straight from the input
        IString key(curr);
        curr = close + 1;
        skip();
        THROW_IF(*curr != ':', "missing ':', in JSON object");
        curr++;
        skip();
        Ref value = Ref(new Value());
        curr = value->parse(curr, stringEncoding);
        (*obj)[key] = value;
        skip();
        if (*curr == '}') {
          break;
        }
        THROW_IF(*curr != ',', "malformed value in JSON object");
        curr++;
        skip();
      }
      curr++;
    } else {
      // Number
      char* after;
      setNumber(strtod(curr, &after));
      curr = after;
    }
    return curr;
  }